

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  string *psVar1;
  ostream *poVar2;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream progressArg;
  EchoProgress *progress_local;
  cmMakefileTargetGenerator *this_local;
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator)
  ;
  std::__cxx11::string::operator=((string *)progress,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)progress,"/CMakeFiles");
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"$(CMAKE_PROGRESS_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->NumberOfProgressActions);
  std::operator<<(poVar2,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&progress->Arg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir = this->LocalGenerator->GetBinaryDirectory();
  progress.Dir += "/CMakeFiles";
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}